

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleMainExtended.cpp
# Opt level: O1

int logFileCallBack(int index,char **buff)

{
  char *__s;
  size_t sVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"log to ",7);
  __s = buff[(long)index + 1];
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x112158);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  return index + 1;
}

Assistant:

int logFileCallBack(int index, char **buff) {
    index++;
    cout << "log to " << buff[index] << endl;
    return index; // +1 because one further argument has been used
}